

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar10;
  pointer pcVar11;
  byte bVar12;
  double dVar13;
  pointer pMVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  undefined8 uVar19;
  IVal *pIVar20;
  long lVar21;
  long lVar22;
  undefined8 *puVar23;
  long lVar24;
  Matrix<float,_4,_2> *val;
  IVal *pIVar25;
  _Base_ptr p_Var26;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  *pBVar27;
  FloatFormat *pFVar28;
  byte bVar29;
  TestStatus *pTVar30;
  IVal in2;
  IVal in3;
  IVal in0;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  outputs;
  IVal in1;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  FuncSet funcs;
  ResultCollector status;
  ostringstream oss;
  undefined4 auStackY_6a8 [2];
  undefined8 uStackY_6a0;
  float in_stack_fffffffffffff968;
  _Alloc_hider _Var31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_678;
  size_t local_670;
  string local_668;
  ulong local_648;
  FloatFormat *local_640;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  *local_638;
  long local_630;
  long local_628;
  TestStatus *local_620;
  undefined1 local_618 [12];
  YesNoMaybe YStack_60c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  double local_5f8;
  Precision local_5f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_5e8;
  undefined4 local_5e0;
  double adStack_5b8 [2];
  ios_base local_5a8 [8];
  ios_base local_5a0 [264];
  FloatFormat local_498;
  long local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_468;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  local_438;
  undefined1 local_408 [16];
  IVal local_3f8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_338;
  pointer local_2d8;
  pointer local_2d0;
  pointer local_2c8;
  pointer local_2c0;
  undefined1 local_2b8 [12];
  YesNoMaybe YStack_2ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  _Rb_tree_node_base *local_298;
  double local_290;
  IVal local_258;
  ResultCollector local_1f8;
  undefined1 local_1a8 [112];
  undefined8 local_138 [33];
  
  this_00 = this->m_samplings;
  pFVar28 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  uStackY_6a0 = 0x8e7b64;
  local_620 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  uStackY_6a0 = 0x8e7b8b;
  local_640 = pFVar28;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,4,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_338,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar28,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar17 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffff968);
  pMVar14 = local_338.in0.
            super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_670 = (long)local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  uStackY_6a0 = 0x8e7baf;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>::
  Outputs(&local_438,local_670);
  local_498.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_498.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_498.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_498.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_498.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_498.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_498.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_498.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_498._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStackY_6a0 = 0x8e7c05;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_678 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_2d8 = local_338.in0.
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2d0 = local_338.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2c8 = local_338.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2c0 = local_338.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3f8.m_data.m_data[1].m_data[3].m_lo =
       (double)local_438.out0.
               super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_3f8.m_data.m_data[1].m_data[3].m_hi =
       (double)local_438.out1.
               super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_618 + 8);
  uStackY_6a0 = 0x8e7c89;
  local_618._0_8_ = local_678;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  uStackY_6a0 = 0x8e7c9d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  uStackY_6a0 = 0x8e7cb3;
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  uStackY_6a0 = 0x8e7cc7;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
  uStackY_6a0 = 0x8e7cdb;
  local_638 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  uStackY_6a0 = 0x8e7ce8;
  std::ios_base::~ios_base(local_5a0);
  uStackY_6a0 = 0x8e7cf5;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var5 = (_Rb_tree_node_base *)(local_2b8 + 8);
  local_2b8._8_4_ = _S_red;
  local_2a8._M_allocated_capacity = 0;
  local_290 = 0.0;
  pSVar8 = (local_638->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  uStackY_6a0 = 0x8e7d31;
  local_2a8._8_8_ = p_Var5;
  local_298 = p_Var5;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_2b8);
  if ((_Rb_tree_node_base *)local_2a8._8_8_ != p_Var5) {
    uVar19 = local_2a8._8_8_;
    do {
      uStackY_6a0 = 0x8e7d53;
      (**(code **)(**(long **)(uVar19 + 0x20) + 0x30))(*(long **)(uVar19 + 0x20),local_1a8);
      uStackY_6a0 = 0x8e7d5b;
      uVar19 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar19);
    } while ((_Rb_tree_node_base *)uVar19 != p_Var5);
  }
  pBVar27 = local_638;
  if (local_290 != 0.0) {
    poVar4 = (ostringstream *)(local_618 + 8);
    local_618._0_8_ = local_678;
    uStackY_6a0 = 0x8e7d90;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    uStackY_6a0 = 0x8e7da4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    uStackY_6a0 = 0x8e7db9;
    std::__cxx11::stringbuf::str();
    uStackY_6a0 = 0x8e7dd1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_408._0_8_,local_408._8_8_);
    uStackY_6a0 = 0x8e7de5;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_408._0_8_ != (IVal *)(local_408 + 0x10)) {
      uStackY_6a0 = 0x8e7e06;
      operator_delete((void *)local_408._0_8_,local_3f8.m_data.m_data[0].m_data[0]._0_8_ + 1);
    }
    uStackY_6a0 = 0x8e7e15;
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    uStackY_6a0 = 0x8e7e22;
    std::ios_base::~ios_base(local_5a0);
  }
  uStackY_6a0 = 0x8e7e2f;
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_2b8);
  uStackY_6a0 = 0x8e7e43;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  uStackY_6a0 = 0x8e7e50;
  std::ios_base::~ios_base((ios_base *)local_138);
  pSVar9 = (pBVar27->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  uStackY_6a0 = 0x8e7e75;
  (*pSVar9->_vptr_ShaderExecutor[2])
            (pSVar9,local_670,&local_2d8,&local_3f8.m_data.m_data[1].m_data[3].m_lo,0);
  uStackY_6a0 = 0x8e7e82;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_618);
  uStackY_6a0 = 0x8e7e8f;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_1a8);
  uStackY_6a0 = 0x8e7e9c;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_2b8);
  uStackY_6a0 = 0x8e7eb8;
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_468,
             (pBVar27->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.m_ptr,
             (IVal *)local_618);
  uStackY_6a0 = 0x8e7ed4;
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (pBVar27->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_408);
  uStackY_6a0 = 0x8e7eeb;
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (pBVar27->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffff968);
  uStackY_6a0 = 0x8e7f04;
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (pBVar27->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_668);
  uStackY_6a0 = 0x8e7f20;
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_468,
             (pBVar27->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  uStackY_6a0 = 0x8e7f3c;
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_468,
             (pBVar27->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.m_ptr,
             (IVal *)local_2b8);
  if (local_338.in0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar14) {
LAB_008e89b2:
    poVar4 = (ostringstream *)(local_618 + 8);
    local_618._0_8_ = local_678;
    uStackY_6a0 = 0x8e89cb;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    uStackY_6a0 = 0x8e89df;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar30 = local_620;
    uStackY_6a0 = 0x8e89f1;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    uStackY_6a0 = 0x8e8a05;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    uStackY_6a0 = 0x8e8a19;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
    uStackY_6a0 = 0x8e8a28;
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    uStackY_6a0 = 0x8e8a35;
    std::ios_base::~ios_base(local_5a0);
    uStackY_6a0 = 0x8e8a5c;
    local_618._0_8_ = &local_608;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"Pass","");
    pTVar30->m_code = QP_TEST_RESULT_PASS;
    (pTVar30->m_description)._M_dataplus._M_p = (pointer)&(pTVar30->m_description).field_2;
    uStackY_6a0 = 0x8e8a87;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar30->m_description,local_618._0_8_,
               (char *)(local_618._0_8_ + CONCAT44(YStack_60c,local_618._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._0_8_ == &local_608) goto LAB_008e8b97;
    uVar19 = (_Base_ptr)
             CONCAT44(local_608._M_allocated_capacity._4_4_,local_608._M_allocated_capacity._0_4_);
    local_2b8._0_8_ = local_618._0_8_;
  }
  else {
    local_470 = local_670 + (local_670 == 0);
    lVar22 = 0;
    local_628 = 0;
    local_648 = 0;
    pFVar28 = local_640;
    do {
      uStackY_6a0 = 0x8e7f89;
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_1a8);
      uStackY_6a0 = 0x8e7f99;
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_2b8);
      local_688._M_allocated_capacity = 0;
      local_688._8_4_ = 0.0;
      local_688._12_4_ = 0.0;
      _Var31._M_p = (pointer)0x0;
      lVar24 = 4;
      do {
        auStackY_6a8[lVar24] =
             *(undefined4 *)
              ((long)(((local_338.in0.
                        super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data + -1) +
              lVar24 * 4 + lVar22);
        *(undefined4 *)(&stack0xfffffffffffff968 + lVar24 * 4) =
             *(undefined4 *)
              ((long)((local_338.in0.
                       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
              lVar24 * 4 + lVar22);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 8);
      uStackY_6a0 = 0x8e7ff0;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                ((IVal *)local_408,pFVar28,(Matrix<float,_4,_2> *)&stack0xfffffffffffff968);
      uStackY_6a0 = 0x8e8003;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_618,pFVar28,(IVal *)local_408);
      uStackY_6a0 = 0x8e8018;
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_468,
                           (pBVar27->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      lVar24 = 0;
      do {
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar24) =
             *(undefined8 *)((long)&local_608 + lVar24);
        dVar13 = *(double *)(local_618 + lVar24 + 8);
        pbVar2 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar24;
        *(undefined8 *)pbVar2 = *(undefined8 *)(local_618 + lVar24);
        *(double *)(pbVar2 + 8) = dVar13;
        dVar13 = *(double *)((long)adStack_5b8 + lVar24 + 8);
        pbVar2 = &(pIVar20->m_data).m_data[1].m_data[0].m_hasNaN + lVar24;
        *(undefined8 *)pbVar2 = *(undefined8 *)((long)adStack_5b8 + lVar24);
        *(double *)(pbVar2 + 8) = dVar13;
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[1].m_data[0].m_hi + lVar24) =
             *(undefined8 *)(local_5a8 + lVar24);
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x60);
      uStackY_6a0 = 0x8e806f;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar27->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      uStackY_6a0 = 0x8e807f;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar27->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      uStackY_6a0 = 0x8e808f;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar27->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_5f0 = (pBVar27->m_caseCtx).precision;
      local_5f8 = pFVar28->m_maxValue;
      local_618._0_8_ = *(undefined8 *)pFVar28;
      local_618._8_4_ = pFVar28->m_fractionBits;
      YStack_60c = pFVar28->m_hasSubnormal;
      local_608._M_allocated_capacity._0_4_ = pFVar28->m_hasInf;
      local_608._M_allocated_capacity._4_4_ = pFVar28->m_hasNaN;
      local_608._8_1_ = pFVar28->m_exactPrecision;
      local_608._9_3_ = *(undefined3 *)&pFVar28->field_0x19;
      local_608._12_4_ = *(undefined4 *)&pFVar28->field_0x1c;
      local_5e0 = 0;
      pSVar8 = (pBVar27->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      uStackY_6a0 = 0x8e80ed;
      local_5e8 = &local_468;
      (*pSVar8->_vptr_Statement[3])(pSVar8,local_618);
      uStackY_6a0 = 0x8e8100;
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_468,
                           (pBVar27->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      uStackY_6a0 = 0x8e8118;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_618,&local_498,pIVar20);
      pMVar14 = local_438.out1.
                super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar24 = local_628;
      lVar21 = 0;
      do {
        *(undefined8 *)((long)&local_2a8 + lVar21) = *(undefined8 *)((long)&local_608 + lVar21);
        uVar19 = *(undefined8 *)(local_618 + lVar21 + 8);
        *(undefined8 *)(local_2b8 + lVar21) = *(undefined8 *)(local_618 + lVar21);
        *(undefined8 *)(local_2b8 + lVar21 + 8) = uVar19;
        uVar19 = *(undefined8 *)((long)adStack_5b8 + lVar21 + 8);
        *(undefined8 *)(&local_258.m_data[0].m_hasNaN + lVar21) =
             *(undefined8 *)((long)adStack_5b8 + lVar21);
        *(undefined8 *)((long)&local_258.m_data[0].m_lo + lVar21) = uVar19;
        *(undefined8 *)((long)&local_258.m_data[0].m_hi + lVar21) =
             *(undefined8 *)(local_5a8 + lVar21);
        lVar21 = lVar21 + 0x18;
      } while (lVar21 != 0x60);
      bVar29 = 1;
      pIVar25 = (IVal *)local_2b8;
      lVar21 = 0;
      local_630 = lVar22;
      do {
        uStackY_6a0 = 0x8e8196;
        bVar15 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                           (pIVar25,pMVar14[lVar24].m_data.m_data + lVar21);
        lVar21 = 1;
        pIVar25 = &local_258;
        bVar12 = bVar29 & bVar15;
        bVar29 = 0;
      } while (bVar12 != 0);
      local_618._0_8_ = &local_608;
      uStackY_6a0 = 0x8e81de;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_618,"Shader output 1 is outside acceptable range","");
      uStackY_6a0 = 0x8e81f2;
      bVar15 = tcu::ResultCollector::check(&local_1f8,bVar15,(string *)local_618);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ != &local_608) {
        uStackY_6a0 = 0x8e8219;
        operator_delete((void *)local_618._0_8_,
                        CONCAT44(local_608._M_allocated_capacity._4_4_,
                                 local_608._M_allocated_capacity._0_4_) + 1);
      }
      uStackY_6a0 = 0x8e822d;
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_468,
                           (pBVar27->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      uStackY_6a0 = 0x8e8240;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_618,&local_498,pIVar20);
      pMVar14 = local_438.out0.
                super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = 0;
      do {
        *(undefined8 *)(local_1a8 + lVar22 + 0x10) = *(undefined8 *)((long)&local_608 + lVar22);
        uVar19 = *(undefined8 *)(local_618 + lVar22 + 8);
        *(undefined8 *)(local_1a8 + lVar22) = *(undefined8 *)(local_618 + lVar22);
        *(undefined8 *)(local_1a8 + lVar22 + 8) = uVar19;
        uVar19 = *(undefined8 *)((long)adStack_5b8 + lVar22 + 8);
        *(undefined8 *)(local_1a8 + lVar22 + 0x60) = *(undefined8 *)((long)adStack_5b8 + lVar22);
        *(undefined8 *)(local_1a8 + lVar22 + 0x68) = uVar19;
        *(undefined8 *)((long)local_138 + lVar22) = *(undefined8 *)(local_5a8 + lVar22);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x60);
      bVar29 = 1;
      lVar22 = 0;
      pIVar25 = (IVal *)local_1a8;
      do {
        uStackY_6a0 = 0x8e82b0;
        bVar16 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                           (pIVar25,pMVar14[lVar24].m_data.m_data + lVar22);
        lVar22 = 1;
        bVar12 = bVar29 & bVar16;
        bVar29 = 0;
        pIVar25 = (IVal *)(local_1a8 + 0x60);
      } while (bVar12 != 0);
      local_618._0_8_ = &local_608;
      uStackY_6a0 = 0x8e82f4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_618,"Shader output 0 is outside acceptable range","");
      uStackY_6a0 = 0x8e8308;
      bVar16 = tcu::ResultCollector::check(&local_1f8,bVar16,(string *)local_618);
      lVar22 = local_630;
      pBVar27 = local_638;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ != &local_608) {
        uStackY_6a0 = 0x8e833a;
        operator_delete((void *)local_618._0_8_,
                        CONCAT44(local_608._M_allocated_capacity._4_4_,
                                 local_608._M_allocated_capacity._0_4_) + 1);
      }
      pFVar28 = local_640;
      if (!bVar15 || !bVar16) {
        uVar18 = (int)local_648 + 1;
        local_648 = (ulong)uVar18;
        poVar4 = (ostringstream *)(local_618 + 8);
        lVar22 = local_630;
        if ((int)uVar18 < 0x65) {
          local_618._0_8_ = local_678;
          uStackY_6a0 = 0x8e8380;
          std::__cxx11::ostringstream::ostringstream(poVar4);
          uStackY_6a0 = 0x8e8394;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
          uStackY_6a0 = 0x8e83a8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
          uStackY_6a0 = 0x8e83bc;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar10 = (pBVar27->m_variables).in0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                    .m_ptr;
          val = (Matrix<float,_4,_2> *)(local_408 + 0x10);
          pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
          uStackY_6a0 = 0x8e83eb;
          local_408._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_408,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
          uStackY_6a0 = 0x8e8403;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_408._0_8_,local_408._8_8_);
          uStackY_6a0 = 0x8e8417;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          uStackY_6a0 = 0x8e8432;
          valueToString<tcu::Matrix<float,4,2>>
                    ((string *)&stack0xfffffffffffff968,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     (local_338.in0.
                      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar24),val);
          uStackY_6a0 = 0x8e8443;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,_Var31._M_p,0);
          uStackY_6a0 = 0x8e8457;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var31._M_p != &local_688) {
            uStackY_6a0 = 0x8e8472;
            operator_delete(_Var31._M_p,local_688._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_4,_2> *)local_408._0_8_ != (Matrix<float,_4,_2> *)(local_408 + 0x10)) {
            uStackY_6a0 = 0x8e8497;
            operator_delete((void *)local_408._0_8_,local_3f8.m_data.m_data[0].m_data[0]._0_8_ + 1);
          }
          uStackY_6a0 = 0x8e84ab;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar10 = (pBVar27->m_variables).out0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                    .m_ptr;
          pIVar20 = (IVal *)(local_408 + 0x10);
          pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
          uStackY_6a0 = 0x8e84da;
          local_408._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_408,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
          uStackY_6a0 = 0x8e84f2;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_408._0_8_,local_408._8_8_);
          uStackY_6a0 = 0x8e8506;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          uStackY_6a0 = 0x8e8521;
          valueToString<tcu::Matrix<float,4,2>>
                    ((string *)&stack0xfffffffffffff968,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     (local_438.out0.
                      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar24),
                     (Matrix<float,_4,_2> *)pIVar20);
          uStackY_6a0 = 0x8e8532;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,_Var31._M_p,0);
          uStackY_6a0 = 0x8e8546;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          uStackY_6a0 = 0x8e855a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,"\tExpected range: ",0x11);
          uStackY_6a0 = 0x8e8574;
          intervalToString<tcu::Matrix<float,4,2>>
                    (&local_668,(shaderexecutor *)&local_498,(FloatFormat *)local_1a8,pIVar20);
          uStackY_6a0 = 0x8e8586;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,local_668._M_dataplus._M_p,local_668._M_string_length);
          uStackY_6a0 = 0x8e859a;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_668._M_dataplus._M_p != &local_668.field_2) {
            uStackY_6a0 = 0x8e85b6;
            operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var31._M_p != &local_688) {
            uStackY_6a0 = 0x8e85d1;
            operator_delete(_Var31._M_p,local_688._M_allocated_capacity + 1);
          }
          if ((IVal *)local_408._0_8_ != (IVal *)(local_408 + 0x10)) {
            uStackY_6a0 = 0x8e85f6;
            operator_delete((void *)local_408._0_8_,local_3f8.m_data.m_data[0].m_data[0]._0_8_ + 1);
          }
          uStackY_6a0 = 0x8e860a;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
          pVVar10 = (pBVar27->m_variables).out1.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                    .m_ptr;
          pIVar20 = (IVal *)(local_408 + 0x10);
          pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
          uStackY_6a0 = 0x8e8639;
          local_408._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_408,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
          uStackY_6a0 = 0x8e8651;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,(char *)local_408._0_8_,local_408._8_8_);
          uStackY_6a0 = 0x8e8665;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
          uStackY_6a0 = 0x8e8680;
          valueToString<tcu::Matrix<float,4,2>>
                    ((string *)&stack0xfffffffffffff968,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     (local_438.out1.
                      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar24),
                     (Matrix<float,_4,_2> *)pIVar20);
          uStackY_6a0 = 0x8e8691;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,_Var31._M_p,0);
          uStackY_6a0 = 0x8e86a5;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          uStackY_6a0 = 0x8e86b9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,"\tExpected range: ",0x11);
          uStackY_6a0 = 0x8e86d3;
          intervalToString<tcu::Matrix<float,4,2>>
                    (&local_668,(shaderexecutor *)&local_498,(FloatFormat *)local_2b8,pIVar20);
          uStackY_6a0 = 0x8e86e5;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar4,local_668._M_dataplus._M_p,local_668._M_string_length);
          uStackY_6a0 = 0x8e86f9;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_668._M_dataplus._M_p != &local_668.field_2) {
            uStackY_6a0 = 0x8e8715;
            operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var31._M_p != &local_688) {
            uStackY_6a0 = 0x8e8730;
            operator_delete(_Var31._M_p,local_688._M_allocated_capacity + 1);
          }
          if ((IVal *)local_408._0_8_ != (IVal *)(local_408 + 0x10)) {
            uStackY_6a0 = 0x8e8755;
            operator_delete((void *)local_408._0_8_,local_3f8.m_data.m_data[0].m_data[0]._0_8_ + 1);
          }
          uStackY_6a0 = 0x8e8769;
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
          uStackY_6a0 = 0x8e8778;
          std::__cxx11::ostringstream::~ostringstream(poVar4);
          uStackY_6a0 = 0x8e8785;
          std::ios_base::~ios_base(local_5a0);
          lVar22 = local_630;
        }
      }
      local_628 = local_628 + 1;
      lVar22 = lVar22 + 0x20;
    } while (local_628 != local_470);
    iVar17 = (int)local_648;
    if (iVar17 < 0x65) {
      if (iVar17 == 0) goto LAB_008e89b2;
    }
    else {
      poVar4 = (ostringstream *)(local_618 + 8);
      local_618._0_8_ = local_678;
      uStackY_6a0 = 0x8e87cc;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      uStackY_6a0 = 0x8e87e0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      uStackY_6a0 = 0x8e87eb;
      std::ostream::operator<<(poVar4,iVar17 + -100);
      uStackY_6a0 = 0x8e87ff;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      uStackY_6a0 = 0x8e8813;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
      uStackY_6a0 = 0x8e8822;
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      uStackY_6a0 = 0x8e882f;
      std::ios_base::~ios_base(local_5a0);
    }
    poVar4 = (ostringstream *)(local_618 + 8);
    local_618._0_8_ = local_678;
    uStackY_6a0 = 0x8e8852;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    uStackY_6a0 = 0x8e885c;
    std::ostream::operator<<(poVar4,iVar17);
    uStackY_6a0 = 0x8e8870;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    uStackY_6a0 = 0x8e887d;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    uStackY_6a0 = 0x8e8891;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    uStackY_6a0 = 0x8e88a5;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
    uStackY_6a0 = 0x8e88b4;
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    uStackY_6a0 = 0x8e88c1;
    std::ios_base::~ios_base(local_5a0);
    uStackY_6a0 = 0x8e88ce;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
    uStackY_6a0 = 0x8e88dd;
    std::ostream::operator<<(local_618,iVar17);
    pTVar30 = local_620;
    uStackY_6a0 = 0x8e88f7;
    std::__cxx11::stringbuf::str();
    uStackY_6a0 = 0x8e890b;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
    uStackY_6a0 = 0x8e891b;
    std::ios_base::~ios_base(local_5a8);
    local_618._0_8_ = &local_608;
    uStackY_6a0 = 0x8e8942;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_618," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)
             (CONCAT44(YStack_60c,local_618._8_4_) + CONCAT44(YStack_2ac,local_2b8._8_4_));
    uVar19 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ != &local_2a8) {
      uVar19 = local_2a8._M_allocated_capacity;
    }
    if ((ulong)uVar19 < p_Var3) {
      p_Var26 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ != &local_608) {
        p_Var26 = (_Base_ptr)
                  CONCAT44(local_608._M_allocated_capacity._4_4_,
                           local_608._M_allocated_capacity._0_4_);
      }
      if (p_Var26 < p_Var3) goto LAB_008e89a0;
      uStackY_6a0 = 0x8e8ab6;
      puVar23 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_618,0,(char *)0x0,local_2b8._0_8_);
    }
    else {
LAB_008e89a0:
      uStackY_6a0 = 0x8e89ad;
      puVar23 = (undefined8 *)std::__cxx11::string::_M_append(local_2b8,local_618._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar23 + 2);
    if ((double *)*puVar23 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar23 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar23 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar23;
    }
    local_1a8._8_8_ = puVar23[1];
    *puVar23 = pdVar1;
    puVar23[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar30->m_code = QP_TEST_RESULT_FAIL;
    (pTVar30->m_description)._M_dataplus._M_p = (pointer)&(pTVar30->m_description).field_2;
    uStackY_6a0 = 0x8e8b34;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar30->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      uStackY_6a0 = 0x8e8b55;
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._0_8_ != &local_608) {
      uStackY_6a0 = 0x8e8b7a;
      operator_delete((void *)local_618._0_8_,
                      CONCAT44(local_608._M_allocated_capacity._4_4_,
                               local_608._M_allocated_capacity._0_4_) + 1);
    }
    uVar19 = local_2a8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ == &local_2a8) goto LAB_008e8b97;
  }
  uStackY_6a0 = 0x8e8b97;
  operator_delete((void *)local_2b8._0_8_,(ulong)((long)&((_Base_ptr)uVar19)->_M_color + 1));
LAB_008e8b97:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    uStackY_6a0 = 0x8e8bb8;
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    uStackY_6a0 = 0x8e8bd9;
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  uStackY_6a0 = 0x8e8be6;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_468);
  if (local_438.out1.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_6a0 = 0x8e8c03;
    operator_delete(local_438.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438.out0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_6a0 = 0x8e8c20;
    operator_delete(local_438.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_6a0 = 0x8e8c3d;
    operator_delete(local_338.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_6a0 = 0x8e8c5a;
    operator_delete(local_338.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_6a0 = 0x8e8c77;
    operator_delete(local_338.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_6a0 = 0x8e8c94;
    operator_delete(local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar30;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}